

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

type_conflict8 __thiscall chaiscript::parse_num<long>(chaiscript *this,string_view t_str)

{
  char cVar1;
  const_iterator pvVar2;
  value_type c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  long t;
  string_view t_str_local;
  
  t_str_local._M_len = t_str._M_len;
  __range2 = (string_view *)0x0;
  t = (long)this;
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&t);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&t);
  for (; ((__end2 != pvVar2 && (cVar1 = *__end2, '/' < cVar1)) && (cVar1 < ':'));
      __end2 = __end2 + 1) {
    __range2 = (string_view *)((long)(cVar1 + -0x30) + (long)__range2 * 10);
  }
  return (type_conflict8)__range2;
}

Assistant:

[[nodiscard]] constexpr auto parse_num(const std::string_view t_str) noexcept -> typename std::enable_if<std::is_integral<T>::value, T>::type {
    T t = 0;
    for (const auto c : t_str) {
      if (c < '0' || c > '9') {
        return t;
      }
      t *= 10;
      t += c - '0';
    }
    return t;
  }